

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O0

JDIMENSION get_8bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  uint uVar9;
  undefined8 *puVar10;
  size_t sVar11;
  long lVar12;
  long in_RSI;
  long *in_RDI;
  double dVar13;
  double dVar14;
  double dVar15;
  int ps;
  int aindex;
  int bindex;
  int gindex;
  int rindex;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  int t;
  JSAMPARRAY image_ptr;
  int cmaplen;
  JSAMPARRAY colormap;
  bmp_source_ptr source;
  double ktmp;
  double ytmp;
  double mtmp;
  double ctmp;
  double local_c0;
  double local_b8;
  double local_b0;
  int local_94;
  undefined1 *local_90;
  byte *local_88;
  double local_40;
  double local_38;
  double local_30;
  
  plVar8 = *(long **)(in_RSI + 0x38);
  iVar2 = *(int *)(in_RSI + 0x54);
  if (*(int *)(in_RSI + 0x58) == 0) {
    sVar11 = fread(*(void **)(in_RSI + 0x60),1,(ulong)*(uint *)(in_RSI + 0x4c),
                   *(FILE **)(in_RSI + 0x18));
    if (sVar11 != *(uint *)(in_RSI + 0x4c)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x2b;
      (**(code **)*in_RDI)(in_RDI);
    }
    local_88 = *(byte **)(in_RSI + 0x60);
  }
  else {
    *(int *)(in_RSI + 0x48) = *(int *)(in_RSI + 0x48) + -1;
    puVar10 = (undefined8 *)
              (**(code **)(in_RDI[1] + 0x38))
                        (in_RDI,*(undefined8 *)(in_RSI + 0x40),*(undefined4 *)(in_RSI + 0x48),1,0);
    local_88 = (byte *)*puVar10;
  }
  local_90 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  if (*(int *)((long)in_RDI + 0x3c) == 1) {
    for (local_94 = (int)in_RDI[6]; local_94 != 0; local_94 = local_94 + -1) {
      bVar1 = *local_88;
      if (iVar2 <= (int)(uint)bVar1) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x3f1;
        (**(code **)*in_RDI)(in_RDI);
      }
      *local_90 = *(undefined1 *)(*plVar8 + (long)(int)(uint)bVar1);
      local_90 = local_90 + 1;
      local_88 = local_88 + 1;
    }
  }
  else if (*(int *)((long)in_RDI + 0x3c) == 4) {
    for (local_94 = (int)in_RDI[6]; local_94 != 0; local_94 = local_94 + -1) {
      bVar1 = *local_88;
      if (iVar2 <= (int)(uint)bVar1) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x3f1;
        (**(code **)*in_RDI)(in_RDI);
      }
      lVar12 = (long)(int)(uint)bVar1;
      dVar15 = 1.0 - (double)*(byte *)(*plVar8 + lVar12) / 255.0;
      dVar13 = 1.0 - (double)*(byte *)(plVar8[1] + lVar12) / 255.0;
      dVar14 = 1.0 - (double)*(byte *)(plVar8[2] + lVar12) / 255.0;
      local_b0 = dVar13;
      if (dVar15 < dVar13) {
        local_b0 = dVar15;
      }
      local_c0 = dVar14;
      if (local_b0 < dVar14) {
        local_b8 = dVar13;
        if (dVar15 < dVar13) {
          local_b8 = dVar15;
        }
        local_c0 = local_b8;
      }
      if ((local_c0 != 1.0) || (NAN(local_c0))) {
        local_30 = (dVar15 - local_c0) / (1.0 - local_c0);
        local_38 = (dVar13 - local_c0) / (1.0 - local_c0);
        local_40 = (dVar14 - local_c0) / (1.0 - local_c0);
      }
      else {
        local_40 = 0.0;
        local_38 = 0.0;
        local_30 = 0.0;
      }
      *local_90 = (char)(int)((255.0 - local_30 * 255.0) + 0.5);
      local_90[1] = (char)(int)((255.0 - local_38 * 255.0) + 0.5);
      local_90[2] = (char)(int)((255.0 - local_40 * 255.0) + 0.5);
      local_90[3] = (char)(int)((255.0 - local_c0 * 255.0) + 0.5);
      local_90 = local_90 + 4;
      local_88 = local_88 + 1;
    }
  }
  else {
    iVar3 = rgb_red[*(uint *)((long)in_RDI + 0x3c)];
    iVar4 = rgb_green[*(uint *)((long)in_RDI + 0x3c)];
    iVar5 = rgb_blue[*(uint *)((long)in_RDI + 0x3c)];
    iVar6 = alpha_index[*(uint *)((long)in_RDI + 0x3c)];
    iVar7 = rgb_pixelsize[*(uint *)((long)in_RDI + 0x3c)];
    if (iVar6 < 0) {
      for (local_94 = (int)in_RDI[6]; local_94 != 0; local_94 = local_94 + -1) {
        uVar9 = (uint)*local_88;
        if (iVar2 <= (int)uVar9) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x3f1;
          (**(code **)*in_RDI)(in_RDI);
        }
        local_90[iVar3] = *(undefined1 *)(*plVar8 + (long)(int)uVar9);
        local_90[iVar4] = *(undefined1 *)(plVar8[1] + (long)(int)uVar9);
        local_90[iVar5] = *(undefined1 *)(plVar8[2] + (long)(int)uVar9);
        local_90 = local_90 + iVar7;
        local_88 = local_88 + 1;
      }
    }
    else {
      for (local_94 = (int)in_RDI[6]; local_94 != 0; local_94 = local_94 + -1) {
        uVar9 = (uint)*local_88;
        if (iVar2 <= (int)uVar9) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x3f1;
          (**(code **)*in_RDI)(in_RDI);
        }
        local_90[iVar3] = *(undefined1 *)(*plVar8 + (long)(int)uVar9);
        local_90[iVar4] = *(undefined1 *)(plVar8[1] + (long)(int)uVar9);
        local_90[iVar5] = *(undefined1 *)(plVar8[2] + (long)(int)uVar9);
        local_90[iVar6] = 0xff;
        local_90 = local_90 + iVar7;
        local_88 = local_88 + 1;
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_8bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 8-bit colormap indexes */
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  register JSAMPARRAY colormap = source->colormap;
  int cmaplen = source->cmap_length;
  JSAMPARRAY image_ptr;
  register int t;
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;

  if (source->use_inversion_array) {
    /* Fetch next row from virtual array */
    source->source_row--;
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image,
       source->source_row, (JDIMENSION)1, FALSE);
    inptr = image_ptr[0];
  } else {
    if (!ReadOK(source->pub.input_file, source->iobuffer, source->row_width))
      ERREXIT(cinfo, JERR_INPUT_EOF);
    inptr = source->iobuffer;
  }

  /* Expand the colormap indexes to real data */
  outptr = source->pub.buffer[0];
  if (cinfo->in_color_space == JCS_GRAYSCALE) {
    for (col = cinfo->image_width; col > 0; col--) {
      t = *inptr++;
      if (t >= cmaplen)
        ERREXIT(cinfo, JERR_BMP_OUTOFRANGE);
      *outptr++ = colormap[0][t];
    }
  } else if (cinfo->in_color_space == JCS_CMYK) {
    for (col = cinfo->image_width; col > 0; col--) {
      t = *inptr++;
      if (t >= cmaplen)
        ERREXIT(cinfo, JERR_BMP_OUTOFRANGE);
      rgb_to_cmyk(colormap[0][t], colormap[1][t], colormap[2][t], outptr,
                  outptr + 1, outptr + 2, outptr + 3);
      outptr += 4;
    }
  } else {
    register int rindex = rgb_red[cinfo->in_color_space];
    register int gindex = rgb_green[cinfo->in_color_space];
    register int bindex = rgb_blue[cinfo->in_color_space];
    register int aindex = alpha_index[cinfo->in_color_space];
    register int ps = rgb_pixelsize[cinfo->in_color_space];

    if (aindex >= 0) {
      for (col = cinfo->image_width; col > 0; col--) {
        t = *inptr++;
        if (t >= cmaplen)
          ERREXIT(cinfo, JERR_BMP_OUTOFRANGE);
        outptr[rindex] = colormap[0][t];
        outptr[gindex] = colormap[1][t];
        outptr[bindex] = colormap[2][t];
        outptr[aindex] = 0xFF;
        outptr += ps;
      }
    } else {
      for (col = cinfo->image_width; col > 0; col--) {
        t = *inptr++;
        if (t >= cmaplen)
          ERREXIT(cinfo, JERR_BMP_OUTOFRANGE);
        outptr[rindex] = colormap[0][t];
        outptr[gindex] = colormap[1][t];
        outptr[bindex] = colormap[2][t];
        outptr += ps;
      }
    }
  }

  return 1;
}